

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parser_eat_newline(VrplibParser *p)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  parser_eat_whitespaces(p);
  pcVar1 = p->at;
  lVar2 = -p->size;
  while( true ) {
    while( true ) {
      lVar3 = (long)p->base - (long)pcVar1;
      if (lVar3 == lVar2) {
        return;
      }
      if (*pcVar1 != '\n') break;
      p->curline = p->curline + 1;
      pcVar1 = pcVar1 + (lVar3 != lVar2);
      p->at = pcVar1;
    }
    if (*pcVar1 != '\r') break;
    pcVar1 = pcVar1 + (lVar3 != lVar2);
    p->at = pcVar1;
    lVar3 = (long)p->base - (long)pcVar1;
    if ((lVar3 != lVar2) && (*pcVar1 == '\n')) {
      pcVar1 = pcVar1 + (lVar3 != lVar2);
      p->at = pcVar1;
    }
    p->curline = p->curline + 1;
  }
  return;
}

Assistant:

static void parser_eat_newline(VrplibParser *p) {
    parser_eat_whitespaces(p);

    while (!parser_is_eof(p) && (*p->at == '\r' || *p->at == '\n')) {
        if (*p->at == '\r') {
            parser_adv(p, 1);
            if (!parser_is_eof(p) && (*p->at == '\n')) {
                parser_adv(p, 1);
            }
            p->curline += 1;
        } else {
            assert(*p->at == '\n');
            p->curline += 1;
            parser_adv(p, 1);
        }
    }
}